

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha.c
# Opt level: O0

int mark_got_writable(link_map *lib)

{
  FILE *pFVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long in_RDI;
  int res;
  Elf64_Addr prot_address;
  size_t protect_size;
  uint i;
  uint is_rela;
  uint rel_count;
  uint rel_size;
  char *strtab;
  Elf64_Addr got;
  Elf64_Addr elf_hash;
  Elf64_Addr gnu_hash;
  Elf64_Sym *symtab;
  Elf64_Addr jmprel;
  Elf64_Rel *rel;
  Elf64_Rela *rela;
  Elf64_Dyn *dentry;
  Elf64_Dyn *dynsec;
  char *local_f8;
  char *local_d8;
  char *local_d0;
  char *local_c0;
  uint local_94;
  size_t local_78;
  uint local_64;
  ulong local_58;
  long *local_20;
  int local_4;
  
  local_58 = 0;
  local_64 = 0;
  local_20 = *(long **)(in_RDI + 0x10);
  if (local_20 == (long *)0x0) {
    local_4 = -1;
  }
  else {
    for (; *local_20 != 0; local_20 = local_20 + 2) {
      if (*local_20 == 2) {
        local_64 = (uint)local_20[1];
      }
      else if (*local_20 == 3) {
        local_58 = local_20[1];
      }
    }
    if (local_58 == 0) {
      local_4 = 0;
    }
    else {
      if (mark_got_writable::page_size == 0) {
        mark_got_writable::page_size = getpagesize();
      }
      pFVar1 = _stderr;
      if (mark_got_writable::page_size < local_64) {
        local_94 = local_64;
      }
      else {
        local_94 = mark_got_writable::page_size;
      }
      local_78 = (size_t)local_94;
      if (local_78 % (ulong)mark_got_writable::page_size != 0) {
        local_78 = ((ulong)mark_got_writable::page_size -
                   local_78 % (ulong)mark_got_writable::page_size) + local_78;
      }
      uVar5 = (ulong)mark_got_writable::page_size;
      if (2 < debug_level) {
        uVar2 = gotcha_gettid();
        uVar3 = getpid();
        local_c0 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha.c"
                           ,0x2f);
        if (local_c0 == (char *)0x0) {
          local_c0 = "";
        }
        if (*(long *)(in_RDI + 8) == 0) {
          local_d0 = "[NULL]";
        }
        else {
          if (**(char **)(in_RDI + 8) == '\0') {
            local_d8 = "[EMPTY]";
          }
          else {
            local_d8 = *(char **)(in_RDI + 8);
          }
          local_d0 = local_d8;
        }
        fprintf(pFVar1,
                "[%d/%d][%s:%u] - Setting library %s GOT table from %p to +%lu to writeable\n",
                (ulong)uVar2,(ulong)uVar3,local_c0 + 1,0xdc,local_d0,(void *)(local_58 & -uVar5),
                local_78);
      }
      iVar4 = mprotect((void *)(local_58 & -uVar5),local_78,7);
      pFVar1 = _stderr;
      if ((iVar4 == -1) && (debug_level != 0)) {
        uVar2 = gotcha_gettid();
        uVar3 = getpid();
        local_f8 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/GOTCHA/src/gotcha.c"
                           ,0x2f);
        if (local_f8 == (char *)0x0) {
          local_f8 = "";
        }
        fprintf(pFVar1,
                "ERROR [%d/%d][%s:%u] - GOTCHA attempted to mark the GOT table as writable and was unable to do so, calls to wrapped functions may likely fail.\n"
                ,(ulong)uVar2,(ulong)uVar3,local_f8 + 1,0xe0);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int mark_got_writable(struct link_map *lib)
{
   static unsigned int page_size = 0;
   INIT_DYNAMIC(lib);
   if (!got)
      return 0;

   if (!page_size)
      page_size = gotcha_getpagesize();

   size_t protect_size = MAX(rel_size, page_size);
   if(protect_size % page_size){
      protect_size += page_size -  ((protect_size) %page_size);
   }
   ElfW(Addr) prot_address = BOUNDARY_BEFORE(got,(ElfW(Addr))page_size);
   debug_printf(3, "Setting library %s GOT table from %p to +%lu to writeable\n",
                LIB_NAME(lib), (void *) prot_address, protect_size);
   int res = gotcha_mprotect((void*)prot_address,protect_size,PROT_READ | PROT_WRITE | PROT_EXEC );
   if(res == -1){ // mprotect returns -1 on an error
      error_printf("GOTCHA attempted to mark the GOT table as writable and was unable to do so, "
                   "calls to wrapped functions may likely fail.\n");
   }

   return 0;
}